

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rune.cc
# Opt level: O1

int re2::fullrune(char *str,int n)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = 0;
  if (0 < n) {
    bVar1 = *str;
    iVar2 = 1;
    if (((char)bVar1 < '\0') &&
       ((n == 1 || ((0xdf < bVar1 && ((n < 3 || (n == 3 && 0xef < bVar1)))))))) {
      return 0;
    }
  }
  return iVar2;
}

Assistant:

int
fullrune(const char *str, int n)
{
	if (n > 0) {
		int c = *(unsigned char*)str;
		if (c < Tx)
			return 1;
		if (n > 1) {
			if (c < T3)
				return 1;
			if (n > 2) {
				if (c < T4 || n > 3)
					return 1;
			}
		}
	}
	return 0;
}